

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O3

void __thiscall
cnn::Concatenate::backward_impl
          (Concatenate *this,vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,
          Tensor *fx,Tensor *dEdf,uint i,Tensor *dEdxi)

{
  pointer puVar1;
  ulong uVar2;
  ulong uVar3;
  SrcEvaluatorType srcEvaluator;
  DstEvaluatorType dstEvaluator;
  add_assign_op<float,_float> local_c1;
  SrcEvaluatorType local_c0;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_a8;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_88;
  DstEvaluatorType local_68;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::internal::evaluator<Eigen::Block<const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>_>,_Eigen::internal::add_assign_op<float,_float>,_0>
  local_50;
  
  puVar1 = (this->src_row_indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(this->src_row_indices).
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)puVar1 >> 2) <= (ulong)i) {
    __assert_fail("i < src_row_indices.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/clab[P]lstm-parser-with-morphology/cnn/cnn/nodes.cc"
                  ,0x47d,
                  "virtual void cnn::Concatenate::backward_impl(const vector<const Tensor *> &, const Tensor &, const Tensor &, unsigned int, Tensor &) const"
                 );
  }
  uVar3 = (ulong)(dEdxi->d).d[0];
  uVar2 = (ulong)puVar1[i];
  Tensor::operator*(&local_88,dEdf);
  if (local_88.
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_cols.m_value < 0 &&
      local_88.
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_data != (PointerType)0x0) {
    __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                  ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,
                  "Eigen::MapBase<Eigen::Block<const Eigen::Map<Eigen::Matrix<float, -1, -1>>>>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<const Eigen::Map<Eigen::Matrix<float, -1, -1>>>, Level = 0]"
                 );
  }
  if ((local_88.
       super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
       .
       super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
       .m_cols.m_value < 0) ||
     ((long)(local_88.
             super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
             .
             super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
             .m_rows.m_value - uVar3) < (long)uVar2)) {
    __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                  ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                  "Eigen::Block<const Eigen::Map<Eigen::Matrix<float, -1, -1>>>::Block(XprType &, Index, Index, Index, Index) [XprType = const Eigen::Map<Eigen::Matrix<float, -1, -1>>, BlockRows = -1, BlockCols = -1, InnerPanel = false]"
                 );
  }
  Tensor::operator*(&local_a8,dEdxi);
  local_c0.
  super_block_evaluator<const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
  .
  super_mapbase_evaluator<Eigen::Block<const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>
  .m_outerStride.m_value =
       local_88.
       super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
       .
       super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
       .m_rows.m_value;
  local_c0.
  super_block_evaluator<const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
  .
  super_mapbase_evaluator<Eigen::Block<const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>
  .m_data = local_88.
            super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
            .
            super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
            .m_data + uVar2;
  if ((local_a8.
       super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
       .
       super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
       .m_rows.m_value == uVar3) &&
     (local_a8.
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_cols.m_value ==
      local_88.
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_cols.m_value)) {
    local_50.m_dst = &local_68;
    local_68.
    super_mapbase_evaluator<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>
    .m_data = local_a8.
              super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
              .
              super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
              .m_data;
    local_50.m_src = &local_c0;
    local_50.m_functor = &local_c1;
    local_68.
    super_mapbase_evaluator<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>
    .m_outerStride.m_value = uVar3;
    local_50.m_dstExpr = &local_a8;
    Eigen::internal::
    dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::internal::evaluator<Eigen::Block<const_Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_-1,_-1,_false>_>,_Eigen::internal::add_assign_op<float,_float>,_0>,_4,_0>
    ::run(&local_50);
    return;
  }
  __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2f2,
                "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Map<Eigen::Matrix<float, -1, -1>>, SrcXprType = Eigen::Block<const Eigen::Map<Eigen::Matrix<float, -1, -1>>>, Functor = Eigen::internal::add_assign_op<float, float>]"
               );
}

Assistant:

void Concatenate::backward_impl(const vector<const Tensor*>& xs,
                             const Tensor& fx,
                             const Tensor& dEdf,
                             unsigned i,
                             Tensor& dEdxi) const {
  assert(i < src_row_indices.size());
  const unsigned rows = dEdxi.d.rows();
  const unsigned begin = src_row_indices[i];
#if HAVE_CUDA
  CUBLAS_CHECK(cublasSaxpy(cublas_handle, rows, kSCALAR_ONE, &dEdf.v[begin], 1, dEdxi.v, 1));
#else
  *dEdxi += (*dEdf).middleRows(begin, rows);
#endif
}